

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::benchmarkFailed(XmlReporter *this,StringRef error)

{
  StringRef attribute;
  XmlFormatting fmt;
  StringRef name;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [24];
  XmlReporter *this_local;
  StringRef error_local;
  
  error_local.m_start = (char *)error.m_size;
  this_local = (XmlReporter *)error.m_start;
  local_30._16_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"failed",&local_51);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_30,(string *)&this->m_xml,(XmlFormatting)local_50);
  name = operator____sr("message",7);
  attribute.m_size = (size_type)error_local.m_start;
  attribute.m_start = (char *)this_local;
  XmlWriter::ScopedElement::writeAttribute((ScopedElement *)local_30,name,attribute);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  fmt = operator|(Newline,Indent);
  XmlWriter::endElement(&this->m_xml,fmt);
  return;
}

Assistant:

void XmlReporter::benchmarkFailed(StringRef error) {
        m_xml.scopedElement("failed").
            writeAttribute("message"_sr, error);
        m_xml.endElement();
    }